

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMocker<void_(int)>::PerformAction
          (FunctionMocker<void_(int)> *this,void *untyped_action,ArgumentTuple *args,
          string *call_description)

{
  tuple<int> local_4c;
  undefined1 local_48 [8];
  Action<void_(int)> action;
  string *call_description_local;
  ArgumentTuple *args_local;
  void *untyped_action_local;
  FunctionMocker<void_(int)> *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)call_description;
  if (untyped_action == (void *)0x0) {
    PerformDefaultAction(this,args,call_description);
  }
  else {
    Action<void_(int)>::Action((Action<void_(int)> *)local_48,(Action<void_(int)> *)untyped_action);
    std::tuple<int>::tuple(&local_4c,args);
    Action<void_(int)>::Perform((Action<void_(int)> *)local_48,&local_4c);
    Action<void_(int)>::~Action((Action<void_(int)> *)local_48);
  }
  return;
}

Assistant:

R PerformAction(const void* untyped_action, ArgumentTuple&& args,
                  const std::string& call_description) const {
    if (untyped_action == nullptr) {
      return PerformDefaultAction(std::move(args), call_description);
    }

    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    return action.Perform(std::move(args));
  }